

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

plain_range_sorted<CSkins::CSkin>
partition_binary<plain_range_sorted<CSkins::CSkin>,CSkins::CSkin>
          (plain_range_sorted<CSkins::CSkin> range,CSkin value)

{
  bool bVar1;
  CSkin *pCVar2;
  long lVar3;
  ulong uVar4;
  CSkin *pCVar5;
  uint uVar6;
  long in_FS_OFFSET;
  plain_range_sorted<CSkins::CSkin> pVar7;
  plain_range<CSkins::CSkin> local_38;
  long local_28;
  
  local_38.end = range.super_plain_range<CSkins::CSkin>.end;
  local_38.begin = range.super_plain_range<CSkins::CSkin>.begin;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = local_38.end;
  pCVar5 = local_38.begin;
  if (local_38.begin < local_38.end) {
    pCVar2 = plain_range<CSkins::CSkin>::back(&local_38);
    bVar1 = CSkins::CSkin::operator<(pCVar2,&value);
    if (bVar1) {
      pCVar2 = (CSkin *)0x0;
      pCVar5 = (CSkin *)0x0;
    }
    else {
      while( true ) {
        uVar6 = (uint)(((long)local_38.end - (long)local_38.begin) / 200);
        pCVar2 = local_38.end;
        pCVar5 = local_38.begin;
        if (uVar6 < 2) break;
        uVar6 = uVar6 - 1 >> 1;
        pCVar2 = (CSkin *)plain_range<CSkins::CSkin>::index
                                    (&local_38,(char *)(ulong)uVar6,
                                     (int)(((long)local_38.end - (long)local_38.begin) % 200));
        bVar1 = CSkins::CSkin::operator<(pCVar2,&value);
        uVar4 = (ulong)(uVar6 + 1);
        if (bVar1) {
          lVar3 = (long)local_38.end - (long)local_38.begin;
          local_38.begin = local_38.begin + uVar4;
          uVar4 = (ulong)((int)(lVar3 / 200) - 1);
        }
        local_38.end = local_38.begin + uVar4;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  pVar7.super_plain_range<CSkins::CSkin>.end = pCVar2;
  pVar7.super_plain_range<CSkins::CSkin>.begin = pCVar5;
  return (plain_range_sorted<CSkins::CSkin>)pVar7.super_plain_range<CSkins::CSkin>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}